

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<EnumNameValue>::Inserter::insertOne
          (Inserter *this,qsizetype pos,EnumNameValue *t)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  EnumNameValue *pEVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  EnumNameValue *pEVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  
  pEVar3 = this->begin;
  lVar11 = this->size;
  pEVar7 = pEVar3 + lVar11;
  this->end = pEVar7;
  this->last = pEVar3 + lVar11 + -1;
  this->where = pEVar3 + pos;
  lVar11 = lVar11 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar11;
  this->sourceCopyAssign = 1;
  if (lVar11 < 1) {
    this->sourceCopyConstruct = 1 - lVar11;
    this->move = 0;
    this->sourceCopyAssign = lVar11;
  }
  if (this->sourceCopyConstruct != 0) {
    pDVar4 = (t->name).d.d;
    (t->name).d.d = (Data *)0x0;
    (pEVar7->name).d.d = pDVar4;
    pcVar5 = (t->name).d.ptr;
    (t->name).d.ptr = (char16_t *)0x0;
    (pEVar7->name).d.ptr = pcVar5;
    qVar6 = (t->name).d.size;
    (t->name).d.size = 0;
    (pEVar7->name).d.size = qVar6;
    pDVar4 = (t->valueStr).d.d;
    (t->valueStr).d.d = (Data *)0x0;
    (pEVar7->valueStr).d.d = pDVar4;
    pcVar5 = (t->valueStr).d.ptr;
    (t->valueStr).d.ptr = (char16_t *)0x0;
    (pEVar7->valueStr).d.ptr = pcVar5;
    qVar6 = (t->valueStr).d.size;
    (t->valueStr).d.size = 0;
    (pEVar7->valueStr).d.size = qVar6;
    pEVar7->value = t->value;
    this->size = this->size + 1;
    return;
  }
  pDVar4 = pEVar7[-1].name.d.d;
  pcVar5 = pEVar7[-1].name.d.ptr;
  pEVar7[-1].name.d.d = (Data *)0x0;
  pEVar7[-1].name.d.ptr = (char16_t *)0x0;
  (pEVar7->name).d.d = pDVar4;
  (pEVar7->name).d.ptr = pcVar5;
  qVar6 = pEVar7[-1].name.d.size;
  pEVar7[-1].name.d.size = 0;
  (pEVar7->name).d.size = qVar6;
  pDVar4 = pEVar7[-1].valueStr.d.d;
  pcVar5 = pEVar7[-1].valueStr.d.ptr;
  pEVar7[-1].valueStr.d.d = (Data *)0x0;
  pEVar7[-1].valueStr.d.ptr = (char16_t *)0x0;
  (pEVar7->valueStr).d.d = pDVar4;
  (pEVar7->valueStr).d.ptr = pcVar5;
  qVar6 = pEVar7[-1].valueStr.d.size;
  pEVar7[-1].valueStr.d.size = 0;
  (pEVar7->valueStr).d.size = qVar6;
  pEVar7->value = pEVar7[-1].value;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar11 = 0;
    lVar12 = 0;
    do {
      pEVar7 = this->last;
      puVar2 = (undefined8 *)((long)&(pEVar7->name).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar1 = (undefined8 *)((long)&pEVar7[-1].name.d.d + lVar11);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)((long)&(pEVar7->name).d.d + lVar11);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar2 = (undefined8 *)((long)&pEVar7[-1].name.d.d + lVar11);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pEVar7->name).d.size + lVar11);
      *(undefined8 *)((long)&(pEVar7->name).d.size + lVar11) =
           *(undefined8 *)((long)pEVar7 + lVar11 + -0x28);
      *(undefined8 *)((long)pEVar7 + lVar11 + -0x28) = uVar8;
      puVar2 = (undefined8 *)((long)&(pEVar7->valueStr).d.d + lVar11);
      uVar8 = *puVar2;
      uVar9 = puVar2[1];
      puVar2 = (undefined8 *)((long)pEVar7 + lVar11 + -0x20);
      uVar10 = puVar2[1];
      puVar1 = (undefined8 *)((long)&(pEVar7->valueStr).d.d + lVar11);
      *puVar1 = *puVar2;
      puVar1[1] = uVar10;
      puVar2 = (undefined8 *)((long)pEVar7 + lVar11 + -0x20);
      *puVar2 = uVar8;
      puVar2[1] = uVar9;
      uVar8 = *(undefined8 *)((long)&(pEVar7->valueStr).d.size + lVar11);
      *(undefined8 *)((long)&(pEVar7->valueStr).d.size + lVar11) =
           *(undefined8 *)((long)pEVar7 + lVar11 + -0x10);
      *(undefined8 *)((long)pEVar7 + lVar11 + -0x10) = uVar8;
      *(undefined4 *)((long)&pEVar7->value + lVar11) = *(undefined4 *)((long)pEVar7 + lVar11 + -8);
      lVar12 = lVar12 + -1;
      lVar11 = lVar11 + -0x38;
    } while (lVar12 != this->move);
  }
  pEVar7 = this->where;
  pDVar4 = (pEVar7->name).d.d;
  (pEVar7->name).d.d = (t->name).d.d;
  (t->name).d.d = pDVar4;
  pcVar5 = (pEVar7->name).d.ptr;
  (pEVar7->name).d.ptr = (t->name).d.ptr;
  (t->name).d.ptr = pcVar5;
  qVar6 = (pEVar7->name).d.size;
  (pEVar7->name).d.size = (t->name).d.size;
  (t->name).d.size = qVar6;
  pDVar4 = (pEVar7->valueStr).d.d;
  (pEVar7->valueStr).d.d = (t->valueStr).d.d;
  (t->valueStr).d.d = pDVar4;
  pcVar5 = (pEVar7->valueStr).d.ptr;
  (pEVar7->valueStr).d.ptr = (t->valueStr).d.ptr;
  (t->valueStr).d.ptr = pcVar5;
  qVar6 = (pEVar7->valueStr).d.size;
  (pEVar7->valueStr).d.size = (t->valueStr).d.size;
  (t->valueStr).d.size = qVar6;
  pEVar7->value = t->value;
  return;
}

Assistant:

void setup(qsizetype pos, qsizetype n)
        {
            end = begin + size;
            last = end - 1;
            where = begin + pos;
            qsizetype dist = size - pos;
            sourceCopyConstruct = 0;
            nSource = n;
            move = n - dist; // smaller 0
            sourceCopyAssign = n;
            if (n > dist) {
                sourceCopyConstruct = n - dist;
                move = 0;
                sourceCopyAssign -= sourceCopyConstruct;
            }
        }